

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32 drwav__on_seek_memory(void *pUserData,int offset,drwav_seek_origin origin)

{
  drwav *pWav;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xcc8,"drwav_bool32 drwav__on_seek_memory(void *, int, drwav_seek_origin)");
  }
  if (origin == drwav_seek_origin_current) {
    if (offset < 1) {
      if (*(ulong *)((long)pUserData + 0xf0) < (ulong)(uint)-offset) {
        return 0;
      }
    }
    else if (*(ulong *)((long)pUserData + 0xe8) <
             *(ulong *)((long)pUserData + 0xf0) + (ulong)(uint)offset) {
      return 0;
    }
    *(long *)((long)pUserData + 0xf0) = *(long *)((long)pUserData + 0xf0) + (long)offset;
  }
  else {
    if (*(ulong *)((long)pUserData + 0xe8) < (ulong)(uint)offset) {
      return 0;
    }
    *(long *)((long)pUserData + 0xf0) = (long)offset;
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStream.currentReadPos + offset > pWav->memoryStream.dataSize) {
                return DRWAV_FALSE; /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStream.currentReadPos < (size_t)-offset) {
                return DRWAV_FALSE; /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStream.currentReadPos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStream.dataSize) {
            pWav->memoryStream.currentReadPos = offset;
        } else {
            return DRWAV_FALSE; /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}